

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void disassemble_binary(ifstream *in,ostream *out)

{
  exception *e;
  undefined1 local_68 [8];
  File f;
  ostream *out_local;
  ifstream *in_local;
  
  f.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)out;
  File::parse_file_binary((File *)local_68,in);
  File::output_text((File *)local_68,
                    (ostream *)
                    f.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  File::~File((File *)local_68);
  return;
}

Assistant:

void disassemble_binary(std::ifstream* in, std::ostream* out) {
    try {
        File f = File::parse_file_binary(*in);
        f.output_text(*out);
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}